

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

CURLcode Curl_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  uchar uVar1;
  size_t sVar2;
  char *pcVar3;
  uchar *puVar4;
  void *pvVar5;
  unsigned_long uVar6;
  long lVar7;
  ulong uVar8;
  CURLcode CVar9;
  size_t padding;
  ulong uVar10;
  ulong uVar11;
  unsigned_long i;
  size_t sVar12;
  long lVar13;
  uchar *puVar14;
  
  *outptr = (uchar *)0x0;
  *outlen = 0;
  sVar2 = strlen(src);
  CVar9 = CURLE_BAD_CONTENT_ENCODING;
  if ((sVar2 & 3) == 0 && sVar2 != 0) {
    pcVar3 = strchr(src,0x3d);
    lVar7 = 0;
    if (pcVar3 != (char *)0x0) {
      if (pcVar3 + (ulong)(pcVar3[1] == '=') + 1 != src + sVar2) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      lVar7 = (ulong)(pcVar3[1] == '=') + 1;
    }
    uVar10 = sVar2 >> 2;
    sVar12 = uVar10 * 3 - lVar7;
    puVar4 = (uchar *)(*Curl_cmalloc)(sVar12 + 1);
    if (puVar4 == (uchar *)0x0) {
      CVar9 = CURLE_OUT_OF_MEMORY;
    }
    else {
      lVar7 = 0;
      puVar14 = puVar4;
      do {
        uVar8 = 0;
        lVar13 = 0;
        uVar11 = 0;
        do {
          if (src[lVar13] == 0x3d) {
            uVar8 = uVar8 << 6;
            uVar11 = uVar11 + 1;
          }
          else {
            pvVar5 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/=",
                            (int)src[lVar13],0x42);
            if (pvVar5 == (void *)0x0) {
              lVar13 = 0;
              goto LAB_00507ee0;
            }
            uVar6 = curlx_uztoul((long)pvVar5 - 0x6dffe0);
            uVar8 = uVar8 * 0x40 + uVar6;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 4);
        if (uVar11 == 0) {
          uVar1 = curlx_ultouc(uVar8 & 0xff);
          puVar14[2] = uVar1;
        }
        if (uVar11 < 2) {
          uVar1 = curlx_ultouc(uVar8 >> 8 & 0xff);
          puVar14[1] = uVar1;
        }
        uVar1 = curlx_ultouc(uVar8 >> 0x10 & 0xff);
        *puVar14 = uVar1;
        lVar13 = 3 - uVar11;
LAB_00507ee0:
        if (lVar13 == 0) {
          (*Curl_cfree)(puVar4);
          return CURLE_BAD_CONTENT_ENCODING;
        }
        puVar14 = puVar14 + lVar13;
        src = src + 4;
        lVar7 = lVar7 + 1;
      } while (lVar7 != uVar10 + (uVar10 == 0));
      *puVar14 = '\0';
      *outptr = puVar4;
      *outlen = sVar12;
      CVar9 = CURLE_OK;
    }
  }
  return CVar9;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t srclen = 0;
  size_t padding = 0;
  size_t i;
  size_t numQuantums;
  size_t rawlen = 0;
  const char *padptr;
  unsigned char *pos;
  unsigned char *newstr;

  *outptr = NULL;
  *outlen = 0;
  srclen = strlen(src);

  /* Check the length of the input string is valid */
  if(!srclen || srclen % 4)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Find the position of any = padding characters */
  padptr = strchr(src, '=');
  if(padptr) {
    padding++;
    /* A maximum of two = padding characters is allowed */
    if(padptr[1] == '=')
      padding++;

    /* Check the = padding characters weren't part way through the input */
    if(padptr + padding != src + srclen)
      return CURLE_BAD_CONTENT_ENCODING;
  }

  /* Calculate the number of quantums */
  numQuantums = srclen / 4;

  /* Calculate the size of the decoded string */
  rawlen = (numQuantums * 3) - padding;

  /* Allocate our buffer including room for a null-terminator */
  newstr = malloc(rawlen + 1);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  pos = newstr;

  /* Decode the quantums */
  for(i = 0; i < numQuantums; i++) {
    size_t result = decodeQuantum(pos, src);
    if(!result) {
      free(newstr);

      return CURLE_BAD_CONTENT_ENCODING;
    }

    pos += result;
    src += 4;
  }

  /* Zero terminate */
  *pos = '\0';

  /* Return the decoded data */
  *outptr = newstr;
  *outlen = rawlen;

  return CURLE_OK;
}